

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  ConstColXpr local_120;
  ConstRowXpr local_f0;
  ConstTransposeReturnType local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  local_90;
  Index local_28;
  Index col;
  Index row;
  Index index_local;
  product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  *this_local;
  
  col = 0;
  local_28 = index;
  row = index;
  index_local = (Index)this;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::row
            (&local_f0,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)this,0
            );
  DenseBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>
  ::transpose(&local_c0,
              (DenseBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>
               *)&local_f0);
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_120,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this->m_rhs,local_28);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,1,3,true>const>>
  ::cwiseProduct<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>>
            (&local_90,&local_c0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             &local_120);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_1,_3,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                 *)&local_90);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }